

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O2

void ex_floor(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  t_float *ptVar1;
  t_float *ptVar2;
  int iVar3;
  long lVar4;
  float fVar5;
  
  lVar4 = argv->ex_type;
  if (lVar4 - 0xeU < 2) {
    if (optr->ex_type == 0xf) {
      ptVar2 = (optr->ex_cont).v_vec;
    }
    else {
      optr->ex_type = 0xf;
      ptVar2 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar2;
    }
    ptVar1 = (argv->ex_cont).v_vec;
    iVar3 = e->exp_vsize;
    for (lVar4 = 0; iVar3 != (int)lVar4; lVar4 = lVar4 + 1) {
      fVar5 = floorf(ptVar1[lVar4]);
      ptVar2[lVar4] = fVar5;
    }
  }
  else {
    if (lVar4 == 2) {
      if (optr->ex_type == 0xf) {
        ptVar2 = (optr->ex_cont).v_vec;
        fVar5 = floorf((argv->ex_cont).v_flt);
        iVar3 = e->exp_vsize;
        goto LAB_00190bea;
      }
      optr->ex_type = 2;
      fVar5 = floorf((argv->ex_cont).v_flt);
    }
    else {
      if (lVar4 != 1) {
        pd_error(e,"expr: FUNV_EVAL_UNARY(%d): bad left type %ld\n",0x337);
        return;
      }
      if (optr->ex_type == 0xf) {
        ptVar2 = (optr->ex_cont).v_vec;
        fVar5 = (float)(argv->ex_cont).v_int;
        iVar3 = e->exp_vsize;
LAB_00190bea:
        ex_mkvector(ptVar2,fVar5,iVar3);
        return;
      }
      optr->ex_type = 2;
      fVar5 = (float)(argv->ex_cont).v_int;
    }
    (optr->ex_cont).v_flt = fVar5;
  }
  return;
}

Assistant:

static void
ex_floor(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        struct ex_ex *left;
        t_float *op; /* output pointer */
        t_float *lp, *rp;         /* left and right vector pointers */
        t_float scalar;
        int j;

        left = argv++;
        FUNC_EVAL_UNARY(left, floor, (double), optr, 1);
}